

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes ReadNumber(CSzData *sd,UInt64 *value)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  Byte *pBVar4;
  UInt64 highPart;
  uint uStack_28;
  Byte b;
  UInt32 v;
  uint i;
  Byte mask;
  Byte firstByte;
  UInt64 *value_local;
  CSzData *sd_local;
  
  if (sd->Size == 0) {
    sd_local._4_4_ = 0x10;
  }
  else {
    sd->Size = sd->Size - 1;
    pbVar3 = sd->Data;
    sd->Data = pbVar3 + 1;
    bVar1 = *pbVar3;
    if ((bVar1 & 0x80) == 0) {
      *value = (ulong)bVar1;
      sd_local._4_4_ = 0;
    }
    else if (sd->Size == 0) {
      sd_local._4_4_ = 0x10;
    }
    else {
      sd->Size = sd->Size - 1;
      pbVar3 = sd->Data;
      sd->Data = pbVar3 + 1;
      bVar2 = *pbVar3;
      if ((bVar1 & 0x40) == 0) {
        *value = (ulong)((bVar1 & 0x3f) << 8 | (uint)bVar2);
        sd_local._4_4_ = 0;
      }
      else if (sd->Size == 0) {
        sd_local._4_4_ = 0x10;
      }
      else {
        sd->Size = sd->Size - 1;
        pBVar4 = sd->Data;
        sd->Data = pBVar4 + 1;
        *value = (ulong)CONCAT11(*pBVar4,bVar2);
        v._2_1_ = 0x20;
        for (uStack_28 = 2; uStack_28 < 8; uStack_28 = uStack_28 + 1) {
          if ((bVar1 & v._2_1_) == 0) {
            *value = (ulong)((uint)bVar1 & v._2_1_ - 1) << ((byte)(uStack_28 << 3) & 0x3f) | *value;
            return 0;
          }
          if (sd->Size == 0) {
            return 0x10;
          }
          sd->Size = sd->Size - 1;
          pbVar3 = sd->Data;
          sd->Data = pbVar3 + 1;
          *value = (ulong)*pbVar3 << ((byte)(uStack_28 << 3) & 0x3f) | *value;
          v._2_1_ = (byte)((int)(uint)v._2_1_ >> 1);
        }
        sd_local._4_4_ = 0;
      }
    }
  }
  return sd_local._4_4_;
}

Assistant:

static MY_NO_INLINE SRes ReadNumber(CSzData *sd, UInt64 *value)
{
  Byte firstByte, mask;
  unsigned i;
  UInt32 v;

  SZ_READ_BYTE(firstByte);
  if ((firstByte & 0x80) == 0)
  {
    *value = firstByte;
    return SZ_OK;
  }
  SZ_READ_BYTE(v);
  if ((firstByte & 0x40) == 0)
  {
    *value = (((UInt32)firstByte & 0x3F) << 8) | v;
    return SZ_OK;
  }
  SZ_READ_BYTE(mask);
  *value = v | ((UInt32)mask << 8);
  mask = 0x20;
  for (i = 2; i < 8; i++)
  {
    Byte b;
    if ((firstByte & mask) == 0)
    {
      UInt64 highPart = (unsigned)firstByte & (unsigned)(mask - 1);
      *value |= (highPart << (8 * i));
      return SZ_OK;
    }
    SZ_READ_BYTE(b);
    *value |= ((UInt64)b << (8 * i));
    mask >>= 1;
  }
  return SZ_OK;
}